

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar_p.h
# Opt level: O0

void __thiscall QToolBarPrivate::QToolBarPrivate(QToolBarPrivate *this)

{
  QWidgetPrivate *in_RDI;
  ToolBarArea in_stack_ffffffffffffffec;
  
  QWidgetPrivate::QWidgetPrivate(in_RDI,(QtPrivate_6_10_0)((ulong)in_RDI >> 0x20));
  *(undefined ***)in_RDI = &PTR__QToolBarPrivate_00d1ed20;
  in_RDI->field_0x254 = 0;
  in_RDI->field_0x255 = 0;
  in_RDI->field_0x256 = 1;
  in_RDI->field_0x257 = 1;
  QFlags<Qt::ToolBarArea>::QFlags((QFlags<Qt::ToolBarArea> *)in_RDI,in_stack_ffffffffffffffec);
  *(undefined4 *)&in_RDI[1].field_0x4 = 1;
  *(undefined4 *)&in_RDI[1].field_0x8 = 0;
  QSize::QSize((QSize *)in_RDI);
  *(undefined8 *)&in_RDI[1].field_0x20 = 0;
  *(undefined8 *)&in_RDI[1].field_0x28 = 0;
  QBasicTimer::QBasicTimer((QBasicTimer *)&in_RDI[1].field_0x30);
  return;
}

Assistant:

inline QToolBarPrivate()
        : explicitIconSize(false), explicitToolButtonStyle(false), movable(true), floatable(true),
          allowedAreas(Qt::AllToolBarAreas), orientation(Qt::Horizontal),
          toolButtonStyle(Qt::ToolButtonIconOnly),
          layout(nullptr), state(nullptr)
#ifdef Q_OS_MACOS
        , macWindowDragging(false)
#endif
    { }